

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

String * __thiscall
cplus::utils::List<int_*>::toString(String *__return_storage_ptr__,List<int_*> *this)

{
  StringBuilder stringBuilder;
  StringBuilder local_38;
  
  local_38.value._M_dataplus._M_p = (pointer)&local_38.value.field_2;
  local_38.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128620;
  local_38.value._M_string_length = 0;
  local_38.value.field_2._M_local_buf[0] = '\0';
  StringBuilder::append(&local_38,"cplus::utils::List(");
  StringBuilder::append(&local_38,"size:");
  StringBuilder::append(&local_38,(ulong)this->listSize);
  StringBuilder::append(&local_38,")");
  StringBuilder::toString(__return_storage_ptr__,&local_38);
  StringBuilder::~StringBuilder(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline ::cplus::lang::String toString() const override {
				StringBuilder stringBuilder;
				stringBuilder.append("cplus::utils::List(");
				stringBuilder.append("size:");
				stringBuilder.append((long) size());
				stringBuilder.append(")");
				return stringBuilder.toString();
			}